

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_crusader.cpp
# Opt level: O1

int AF_A_CrusaderSweepLeft(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  PClassActor *type;
  AActor *pAVar8;
  uint uVar9;
  VMValue *pVVar10;
  char *__assertion;
  AActor *dest;
  bool bVar11;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005cb7ed;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    pAVar8 = (AActor *)(param->field_0).field_1.a;
    pVVar10 = param;
    uVar9 = numparam;
    if (pAVar8 != (AActor *)0x0) {
      if ((pAVar8->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
        (pAVar8->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (pAVar8->super_DThinker).super_DObject.Class;
      bVar11 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar9 = (uint)bVar11;
      pVVar10 = (VMValue *)(ulong)(pPVar7 == pPVar4 || bVar11);
      if (pPVar7 != pPVar4 && !bVar11) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005cb7ed;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005cb7c2;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3,pVVar10,uVar9,ret);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar11 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar11) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar11 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005cb7ed;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      dVar1 = (pAVar8->__Pos).Z;
      (pAVar8->Angles).Yaw.Degrees = (pAVar8->Angles).Yaw.Degrees + 5.625;
      dest = (pAVar8->target).field_0.p;
      if ((dest != (AActor *)0x0) &&
         (((dest->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar8->target).field_0.p = (AActor *)0x0;
        dest = (AActor *)0x0;
      }
      type = PClass::FindActor("FastFlameMissile");
      pAVar8 = P_SpawnMissileZAimed(pAVar8,dVar1 + 48.0,dest,type);
      if (pAVar8 != (AActor *)0x0) {
        (pAVar8->Vel).Z = (pAVar8->Vel).Z + 1.0;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005cb7c2:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005cb7ed:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                ,0x36,"int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CrusaderSweepLeft)
{
	PARAM_ACTION_PROLOGUE;

	self->Angles.Yaw += 90./16;
	AActor *misl = P_SpawnMissileZAimed (self, self->Z() + 48, self->target, PClass::FindActor("FastFlameMissile"));
	if (misl != NULL)
	{
		misl->Vel.Z += 1;
	}
	return 0;
}